

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileGuard.h
# Opt level: O1

void __thiscall jbcoin::KeyFileGuard::rmDir(KeyFileGuard *this,path *toRm)

{
  ostream *poVar1;
  log_os<char,_std::char_traits<char>,_std::allocator<char>_> *plVar2;
  int local_20 [2];
  
  boost::filesystem::detail::status((detail *)local_20,toRm,(error_code *)0x0);
  if (local_20[0] == 3) {
    boost::filesystem::detail::remove_all(toRm,(error_code *)0x0);
  }
  else {
    plVar2 = &this->test_->log;
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar2->super_basic_ostream<char,_std::char_traits<char>_>,"Expected ",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (&plVar2->super_basic_ostream<char,_std::char_traits<char>_>,
                        (toRm->m_pathname)._M_dataplus._M_p,(toRm->m_pathname)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," to be an existing directory.",0x1d);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

auto rmDir (path const& toRm)
    {
        if (is_directory (toRm))
            remove_all (toRm);
        else
            test_.log << "Expected " << toRm.string ()
                      << " to be an existing directory." << std::endl;
    }